

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::insert_heap
          (clusterizer<crnlib::vec<16U,_float>_> *this,uint node_index)

{
  vector<unsigned_int> *this_00;
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint min_new_capacity;
  
  fVar1 = (this->m_nodes).m_p[node_index].m_variance;
  uVar2 = this->m_heap_size;
  uVar3 = uVar2 + 1;
  uVar6 = (ulong)uVar3;
  this->m_heap_size = uVar3;
  this_00 = &this->m_heap;
  uVar7 = (this->m_heap).m_size;
  if ((uVar7 <= uVar3) && (min_new_capacity = uVar2 + 2, uVar7 != min_new_capacity)) {
    if (uVar7 <= min_new_capacity) {
      if ((this->m_heap).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,min_new_capacity,uVar7 == uVar3,4,(object_mover)0x0,
                   false);
        uVar7 = (this->m_heap).m_size;
      }
      memset(this_00->m_p + uVar7,0,(ulong)(min_new_capacity - uVar7) << 2);
    }
    (this->m_heap).m_size = min_new_capacity;
  }
  if (1 < uVar3) {
    do {
      uVar5 = uVar6 >> 1;
      puVar4 = (this->m_heap).m_p;
      uVar3 = puVar4[uVar5];
      if (fVar1 < (this->m_nodes).m_p[uVar3].m_variance) break;
      uVar7 = (uint)uVar6;
      puVar4[uVar6] = uVar3;
      uVar6 = uVar5;
    } while (3 < uVar7);
  }
  this_00->m_p[uVar6] = node_index;
  return;
}

Assistant:

void insert_heap(uint node_index) {
    const float variance = m_nodes[node_index].m_variance;
    uint pos = ++m_heap_size;

    if (m_heap_size >= m_heap.size())
      m_heap.resize(m_heap_size + 1);

    for (;;) {
      uint parent = pos >> 1;
      if (!parent)
        break;

      float parent_variance = m_nodes[m_heap[parent]].m_variance;
      if (parent_variance > variance)
        break;

      m_heap[pos] = m_heap[parent];

      pos = parent;
    }

    m_heap[pos] = node_index;
  }